

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sieve.hpp
# Opt level: O0

void __thiscall
primecount::Sieve::pre_sieve<long>
          (Sieve *this,Vector<long,_std::allocator<long>_> *primes,uint64_t c,uint64_t low,
          uint64_t high)

{
  ulong in_RDX;
  Vector<long,_std::allocator<long>_> *in_RSI;
  uint64_t i;
  uint64_t in_stack_00000080;
  uint64_t in_stack_00000088;
  Sieve *in_stack_00000090;
  undefined8 local_30;
  
  reset_sieve((Sieve *)c,low,high);
  for (local_30 = 4; local_30 <= in_RDX; local_30 = local_30 + 1) {
    Vector<long,_std::allocator<long>_>::operator[](in_RSI,local_30);
    cross_off(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  }
  init_counter((Sieve *)low,high,i);
  return;
}

Assistant:

void pre_sieve(const Vector<T>& primes, uint64_t c, uint64_t low, uint64_t high)
  {
    reset_sieve(low, high);
    for (uint64_t i = 4; i <= c; i++)
      cross_off(primes[i], i);

    init_counter(low, high);
  }